

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reversed_tests.cpp
# Opt level: O1

void __thiscall
omp_reversed_move_case_increase_values_Test::TestBody
          (omp_reversed_move_case_increase_values_Test *this)

{
  _List_iterator<int> __tmp;
  _List_node_base *p_Var1;
  _List_const_iterator<int> __tmp_1;
  _List_node_base *p_Var2;
  char *in_R9;
  pointer *__ptr;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  AssertionResult gtest_ar_;
  reversed_container_adapter<std::__cxx11::list<int,_std::allocator<int>_>_> reversed_values;
  list<int,_std::allocator<int>_> values;
  list<int,_std::allocator<int>_> expecting;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  AssertHelper local_a8;
  allocator_type local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  _List_node_base local_90;
  undefined8 local_80;
  string local_78;
  _List_node_base local_58;
  undefined8 local_48;
  _List_node_base local_40;
  
  local_78._M_dataplus._M_p = (pointer)0x400000001;
  local_78._M_string_length = 0x200000003;
  local_78.field_2._M_allocated_capacity._0_4_ = 5;
  p_Var2 = &local_90;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_78;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)&local_58,__l,(allocator_type *)p_Var2);
  local_90._M_next = local_58._M_next;
  local_90._M_prev = local_58._M_prev;
  local_80 = local_48;
  if (local_58._M_next == &local_58) {
    local_90._M_next = &local_90;
    local_90._M_prev = local_90._M_next;
  }
  else {
    (local_58._M_prev)->_M_next = p_Var2;
    (local_58._M_next)->_M_prev = p_Var2;
    local_48 = 0;
    local_58._M_next = &local_58;
    local_58._M_prev = &local_58;
  }
  local_78._M_dataplus._M_p = (char *)0x300000006;
  local_78._M_string_length = 0x500000004;
  local_78.field_2._M_allocated_capacity._0_4_ = 2;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_78;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)&local_40,__l_00,local_a0);
  while (p_Var2 != local_90._M_next) {
    p_Var2 = p_Var2->_M_prev;
    *(int *)&p_Var2[1]._M_next = *(int *)&p_Var2[1]._M_next + 1;
  }
  p_Var2 = &local_90;
  p_Var1 = local_40._M_next;
  if (local_40._M_next != &local_40 && p_Var2 != local_90._M_next) {
    do {
      p_Var2 = p_Var2->_M_prev;
      if (*(int *)&p_Var2[1]._M_next != *(int *)&p_Var1[1]._M_next) {
        local_a0[0] = (allocator_type)0x0;
        goto LAB_00130906;
      }
      p_Var1 = p_Var1->_M_next;
    } while ((p_Var2 != local_90._M_next) && (p_Var1 != &local_40));
  }
  local_a0[0] = (allocator_type)(p_Var1 == &local_40 && p_Var2 == local_90._M_next);
LAB_00130906:
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a0[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_a0,
               (AssertionResult *)
               "std::equal(std::cbegin(reversed_values), std::cend(reversed_values), std::cbegin(expecting), std::cend(expecting))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/reversed_tests.cpp"
               ,0x53,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT44(local_78.field_2._M_allocated_capacity._4_4_,
                               local_78.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  while (local_40._M_next != &local_40) {
    p_Var2 = (((_List_base<int,_std::allocator<int>_> *)&(local_40._M_next)->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(local_40._M_next,0x18);
    local_40._M_next = p_Var2;
  }
  p_Var2 = local_90._M_next;
  while (p_Var1 = local_58._M_next, p_Var2 != &local_90) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  while (p_Var1 != &local_58) {
    p_Var2 = (((_List_base<int,_std::allocator<int>_> *)&p_Var1->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var1,0x18);
    p_Var1 = p_Var2;
  }
  return;
}

Assistant:

TEST(omp_reversed, move_case_increase_values) {
  std::list values = {1, 4, 3, 2, 5};

  auto reversed_values = omp::reversed(std::move(values));

  std::list expecting = {6, 3, 4, 5, 2};

  for (auto &v : reversed_values)
    ++v;

  ASSERT_TRUE(std::equal(std::cbegin(reversed_values),
                         std::cend(reversed_values), std::cbegin(expecting),
                         std::cend(expecting)));
}